

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

_Bool background_thread_create_locked(tsd_t *tsd,uint arena_ind)

{
  uint uVar1;
  malloc_mutex_t *mutex;
  ulong uVar2;
  uint in_ESI;
  int err;
  background_thread_info_t *t0;
  _Bool need_new_thread;
  background_thread_info_t *info;
  size_t thread_ind;
  void *in_stack_00000060;
  _func_void_ptr_void_ptr *in_stack_00000068;
  pthread_attr_t *in_stack_00000070;
  pthread_t *in_stack_00000078;
  _Bool result;
  uint in_stack_ffffffffffffff58;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 uVar4;
  atomic_b_t *tsd_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  tsdn_t *in_stack_ffffffffffffff78;
  background_thread_info_t *pbVar5;
  _Bool _Stack_51;
  
  malloc_mutex_assert_owner
            ((tsdn_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (malloc_mutex_t *)0x124b63);
  pbVar5 = background_thread_info;
  uVar2 = (ulong)in_ESI % max_background_threads;
  malloc_mutex_lock(in_stack_ffffffffffffff78,
                    (malloc_mutex_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
  ;
  tsd_00 = &background_thread_enabled_state;
  mutex = (malloc_mutex_t *)0x0;
  uVar4 = 0;
  uVar1 = in_stack_ffffffffffffff58 & 0xffffff;
  if ((background_thread_enabled_state.repr & 1U) != 0) {
    uVar1 = CONCAT13(pbVar5[uVar2].state == background_thread_stopped,
                     (int3)in_stack_ffffffffffffff58);
  }
  uVar3 = uVar1;
  if ((char)(uVar1 >> 0x18) != '\0') {
    background_thread_init
              ((tsd_t *)&background_thread_enabled_state,(background_thread_info_t *)(ulong)uVar1);
  }
  malloc_mutex_unlock((tsdn_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),mutex)
  ;
  if ((uVar1 & 0x1000000) == 0) {
    _Stack_51 = false;
  }
  else if (in_ESI == 0) {
    pre_reentrancy((tsd_t *)tsd_00,(arena_t *)CONCAT44(uVar4,uVar3));
    uVar1 = background_thread_create_signals_masked
                      (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060);
    post_reentrancy((tsd_t *)tsd_00);
    if (uVar1 == 0) {
      _Stack_51 = false;
    }
    else {
      malloc_printf("<jemalloc>: arena 0 background thread creation failed (%d)\n",(ulong)uVar1);
      malloc_mutex_lock(in_stack_ffffffffffffff78,
                        (malloc_mutex_t *)CONCAT44(uVar1,in_stack_ffffffffffffff70));
      pbVar5[uVar2].state = background_thread_stopped;
      n_background_threads = n_background_threads - 1;
      malloc_mutex_unlock((tsdn_t *)CONCAT44(uVar1,in_stack_ffffffffffffff70),mutex);
      _Stack_51 = true;
    }
  }
  else {
    pbVar5 = background_thread_info;
    malloc_mutex_lock((tsdn_t *)background_thread_info,
                      (malloc_mutex_t *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    pthread_cond_signal((pthread_cond_t *)&pbVar5->cond);
    malloc_mutex_unlock((tsdn_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        mutex);
    _Stack_51 = false;
  }
  return _Stack_51;
}

Assistant:

static bool
background_thread_create_locked(tsd_t *tsd, unsigned arena_ind) {
	assert(have_background_thread);
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);

	/* We create at most NCPUs threads. */
	size_t thread_ind = arena_ind % max_background_threads;
	background_thread_info_t *info = &background_thread_info[thread_ind];

	bool need_new_thread;
	malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
	need_new_thread = background_thread_enabled() &&
	    (info->state == background_thread_stopped);
	if (need_new_thread) {
		background_thread_init(tsd, info);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
	if (!need_new_thread) {
		return false;
	}
	if (arena_ind != 0) {
		/* Threads are created asynchronously by Thread 0. */
		background_thread_info_t *t0 = &background_thread_info[0];
		malloc_mutex_lock(tsd_tsdn(tsd), &t0->mtx);
		assert(t0->state == background_thread_started);
		pthread_cond_signal(&t0->cond);
		malloc_mutex_unlock(tsd_tsdn(tsd), &t0->mtx);

		return false;
	}

	pre_reentrancy(tsd, NULL);
	/*
	 * To avoid complications (besides reentrancy), create internal
	 * background threads with the underlying pthread_create.
	 */
	int err = background_thread_create_signals_masked(&info->thread, NULL,
	    background_thread_entry, (void *)thread_ind);
	post_reentrancy(tsd);

	if (err != 0) {
		malloc_printf("<jemalloc>: arena 0 background thread creation "
		    "failed (%d)\n", err);
		malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
		info->state = background_thread_stopped;
		n_background_threads--;
		malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);

		return true;
	}

	return false;
}